

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excerpt_appender.cpp
# Opt level: O0

void __thiscall
cornelich::excerpt_appender::start_excerpt(excerpt_appender *this,int32_t capacity,int32_t cycle)

{
  bool bVar1;
  int32_t iVar2;
  ulong uVar3;
  element_type *peVar4;
  uint8_t *puVar5;
  ulong uVar6;
  int iVar7;
  undefined1 local_40 [16];
  undefined1 local_30 [28];
  int32_t thread_id;
  int32_t cycle_local;
  int32_t capacity_local;
  excerpt_appender *this_local;
  
  local_30._24_4_ = cycle;
  thread_id = capacity;
  _cycle_local = this;
  local_30._20_4_ = util::get_native_thread_id();
  uVar6 = (ulong)(int)local_30._20_4_;
  uVar3 = vanilla_chronicle_settings::thread_id_mask(&this->m_chronicle->m_settings);
  if ((uVar6 & uVar3) != (long)(int)local_30._20_4_) {
    __assert_fail("(thread_id & m_chronicle.m_settings.thread_id_mask()) == thread_id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jh0x[P]cornelich/cornelich/excerpt_appender.cpp"
                  ,0x34,
                  "void cornelich::excerpt_appender::start_excerpt(std::int32_t, std::int32_t)");
  }
  if (local_30._24_4_ == this->m_last_cycle) {
    if (local_30._20_4_ != this->m_last_thread_id) {
      std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
                (&(this->m_data_region).
                  super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
      this->m_last_thread_id = local_30._20_4_;
    }
  }
  else {
    std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_index_region).
                super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_data_region).
                super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>);
    this->m_last_cycle = local_30._24_4_;
    iVar2 = vanilla_index::last_index_file_number(&this->m_chronicle->m_index,this->m_last_cycle,0);
    this->m_last_index_file_number = iVar2;
    this->m_last_thread_id = local_30._20_4_;
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_data_region);
  if (!bVar1) {
    iVar2 = vanilla_data::find_next_data_file_number
                      (&this->m_chronicle->m_data,local_30._24_4_,local_30._20_4_);
    this->m_last_data_file_number = iVar2;
    vanilla_data::data_for
              ((vanilla_data *)local_30,(int)this->m_chronicle + 0x110,local_30._24_4_,
               local_30._20_4_,SUB41(this->m_last_data_file_number,0));
    std::shared_ptr<cornelich::region>::operator=
              (&this->m_data_region,(shared_ptr<cornelich::region> *)local_30);
    std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)local_30);
  }
  peVar4 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_data_region);
  iVar2 = region::remaining(peVar4);
  if (iVar2 < thread_id + 4) {
    iVar7 = this->m_last_data_file_number + 1;
    this->m_last_data_file_number = iVar7;
    vanilla_data::data_for
              ((vanilla_data *)local_40,(int)this->m_chronicle + 0x110,local_30._24_4_,
               local_30._20_4_,SUB41(iVar7,0));
    std::shared_ptr<cornelich::region>::operator=
              (&this->m_data_region,(shared_ptr<cornelich::region> *)local_40);
    std::shared_ptr<cornelich::region>::~shared_ptr((shared_ptr<cornelich::region> *)local_40);
  }
  peVar4 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_data_region);
  puVar5 = region::data(peVar4);
  peVar4 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_data_region);
  iVar2 = region::position(peVar4);
  util::buffer_view::reset(&this->m_buffer,puVar5 + (long)iVar2 + 4,0,thread_id);
  peVar4 = std::__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornelich::region,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->m_data_region);
  region::data(peVar4);
  this->m_finished = false;
  return;
}

Assistant:

void excerpt_appender::start_excerpt(std::int32_t capacity, std::int32_t cycle)
{
    auto thread_id = util::get_native_thread_id();
    assert((thread_id & m_chronicle.m_settings.thread_id_mask()) == thread_id);

    if (cycle != m_last_cycle)
    {
        m_index_region.reset();

        m_data_region.reset();

        m_last_cycle = cycle;
        m_last_index_file_number = m_chronicle.m_index.last_index_file_number(m_last_cycle, 0);
        m_last_thread_id = thread_id;
    }
    else if (thread_id != m_last_thread_id)
    {
        m_data_region.reset();
        m_last_thread_id = thread_id;
    }

    if (!m_data_region)
    {
        m_last_data_file_number = m_chronicle.m_data.find_next_data_file_number(cycle, thread_id);
        m_data_region = m_chronicle.m_data.data_for(cycle,thread_id, m_last_data_file_number, true);
    }

    if (m_data_region->remaining() < static_cast<std::int32_t>(capacity) + 4) // +4 to store the size later on (see finish())
    {
        m_data_region = m_chronicle.m_data.data_for(cycle, thread_id, ++m_last_data_file_number, true);
    }

    m_buffer.reset(m_data_region->data() + m_data_region->position() + 4, 0, static_cast<std::int32_t>(capacity));
    __builtin_prefetch(m_data_region->data() + 64, 1);
    m_finished = false;
}